

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

ssize_t __thiscall rest_rpc::rpc_client::write(rpc_client *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  ssize_t extraout_RAX;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  unique_lock<std::mutex> lock;
  client_message_type msg;
  unique_lock<std::mutex> local_50;
  client_message_type local_40;
  client_message_type *__args;
  
  local_40.req_id = CONCAT44(in_register_00000034,__fd);
  local_40.content.size_ = *(size_type *)__n;
  __args = &local_40;
  local_40.req_type = (request_type)__buf;
  local_40.content.data_ = *(const_pointer *)(__n + 8);
  *(undefined8 *)__n = 0;
  *(undefined8 *)(__n + 8) = 0;
  *(undefined8 *)(__n + 0x10) = 0;
  std::unique_lock<std::mutex>::unique_lock(&local_50,&this->write_mtx_);
  std::
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::emplace_back<rest_rpc::rpc_client::client_message_type>(&this->outbox_,__args);
  __fd_00 = (int)__args;
  sVar1 = std::
          deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
          ::size(&this->outbox_);
  if (sVar1 < 2) {
    write(this,__fd_00,__buf_00,__n);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  return extraout_RAX;
}

Assistant:

void write(std::uint64_t req_id, request_type type,
             rpc_service::buffer_type &&message, uint32_t func_id) {
    size_t size = message.size();
    assert(size < MAX_BUF_LEN);
    client_message_type msg{req_id, type, {message.release(), size}, func_id};

    std::unique_lock<std::mutex> lock(write_mtx_);
    outbox_.emplace_back(std::move(msg));
    if (outbox_.size() > 1) {
      // outstanding async_write
      return;
    }

    write();
  }